

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O2

int ixmlElement_setAttributeNodeNS(IXML_Element *element,IXML_Attr *newAttr,IXML_Attr **rtAttr)

{
  Nodeptr p_Var1;
  int iVar2;
  Nodeptr p_Var3;
  Nodeptr *pp_Var4;
  IXML_Attr *pIVar5;
  Nodeptr *pp_Var6;
  
  if (newAttr == (IXML_Attr *)0x0 || element == (IXML_Element *)0x0) {
    iVar2 = 0x69;
  }
  else if ((newAttr->n).ownerDocument == (element->n).ownerDocument) {
    if (newAttr->ownerElement == (IXML_Element *)0x0 || newAttr->ownerElement == element) {
      newAttr->ownerElement = element;
      pp_Var6 = &(element->n).firstAttr;
      pp_Var4 = pp_Var6;
      while (pIVar5 = (IXML_Attr *)*pp_Var4, pIVar5 != (IXML_Attr *)0x0) {
        iVar2 = strcmp((pIVar5->n).localName,(newAttr->n).localName);
        if ((iVar2 == 0) &&
           (iVar2 = strcmp((pIVar5->n).namespaceURI,(newAttr->n).namespaceURI), iVar2 == 0)) {
          p_Var1 = (pIVar5->n).prevSibling;
          p_Var3 = (pIVar5->n).nextSibling;
          if (p_Var1 != (Nodeptr)0x0) {
            p_Var1->nextSibling = &newAttr->n;
          }
          if (p_Var3 != (Nodeptr)0x0) {
            p_Var3->prevSibling = &newAttr->n;
          }
          if ((IXML_Attr *)*pp_Var6 == pIVar5) {
            *pp_Var6 = &newAttr->n;
          }
          goto LAB_001232a7;
        }
        pp_Var4 = &(pIVar5->n).nextSibling;
      }
      p_Var1 = *pp_Var6;
      if (*pp_Var6 == (Nodeptr)0x0) {
        *pp_Var6 = &newAttr->n;
        (newAttr->n).prevSibling = (Nodeptr)0x0;
        (newAttr->n).nextSibling = (Nodeptr)0x0;
      }
      else {
        do {
          p_Var3 = p_Var1;
          p_Var1 = p_Var3->nextSibling;
        } while (p_Var1 != (Nodeptr)0x0);
        p_Var3->nextSibling = &newAttr->n;
      }
      pIVar5 = (IXML_Attr *)0x0;
      iVar2 = 0;
      if (rtAttr != (IXML_Attr **)0x0) {
LAB_001232a7:
        *rtAttr = pIVar5;
        iVar2 = 0;
      }
    }
    else {
      iVar2 = 10;
    }
  }
  else {
    iVar2 = 4;
  }
  return iVar2;
}

Assistant:

int ixmlElement_setAttributeNodeNS(
	/* IN */ IXML_Element *element,
	/* IN */ IXML_Attr *newAttr,
	/* OUT */ IXML_Attr **rtAttr)
{
	IXML_Node *attrNode = NULL;
	IXML_Node *node = NULL;
	IXML_Node *prevAttr = NULL;
	IXML_Node *nextAttr = NULL;
	IXML_Node *preSib = NULL;
	IXML_Node *nextSib = NULL;

	if (element == NULL || newAttr == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	if (newAttr->n.ownerDocument != element->n.ownerDocument) {
		return IXML_WRONG_DOCUMENT_ERR;
	}

	if (newAttr->ownerElement != NULL && newAttr->ownerElement != element) {
		return IXML_INUSE_ATTRIBUTE_ERR;
	}

	newAttr->ownerElement = element;
	node = (IXML_Node *)newAttr;
	attrNode = element->n.firstAttr;
	while (attrNode != NULL) {
		if (strcmp(attrNode->localName, node->localName) == 0 &&
			strcmp(attrNode->namespaceURI, node->namespaceURI) ==
				0) {
			/* Found it */
			break;
		} else {
			attrNode = attrNode->nextSibling;
		}
	}
	if (attrNode != NULL) {
		/* already present, will replace by newAttr */
		preSib = attrNode->prevSibling;
		nextSib = attrNode->nextSibling;
		if (preSib != NULL) {
			preSib->nextSibling = node;
		}
		if (nextSib != NULL) {
			nextSib->prevSibling = node;
		}
		if (element->n.firstAttr == attrNode) {
			element->n.firstAttr = node;
		}
		*rtAttr = (IXML_Attr *)attrNode;

	} else {
		/* Add this attribute  */
		if (element->n.firstAttr != NULL) {
			/* Element has attribute already */
			prevAttr = element->n.firstAttr;
			nextAttr = prevAttr->nextSibling;
			while (nextAttr != NULL) {
				prevAttr = nextAttr;
				nextAttr = prevAttr->nextSibling;
			}
			prevAttr->nextSibling = node;
		} else {
			/* This is the first attribute node */
			element->n.firstAttr = node;
			node->prevSibling = NULL;
			node->nextSibling = NULL;
		}
		if (rtAttr != NULL) {
			*rtAttr = NULL;
		}
	}

	return IXML_SUCCESS;
}